

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rastack.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::RAStackAllocator::calculateStackFrame(RAStackAllocator *this)

{
  int *piVar1;
  byte bVar2;
  Error EVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  long *plVar12;
  long *plVar13;
  uint uVar14;
  RAStackAllocator *pRVar15;
  RAStackSlot *__tmp;
  ulong uVar16;
  long lVar17;
  long *plVar18;
  RAStackSlot *__tmp_1;
  long lVar19;
  RAStackSlot *__tmp_2;
  long *plVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ZoneVectorBase *this_00;
  bool bVar24;
  long *local_448;
  ulong local_440;
  ZoneVectorBase local_438;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  
  plVar6 = *(long **)(this + 0x18);
  uVar4 = (ulong)*(uint *)(this + 0x20);
  if (uVar4 != 0) {
    plVar12 = (long *)0x0;
    do {
      lVar8 = *(long *)((long)plVar6 + (long)plVar12);
      bVar2 = *(byte *)(lVar8 + 1);
      if (bVar2 == 0) goto LAB_00129481;
      uVar21 = 0;
      if (bVar2 != 0) {
        for (; (bVar2 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
        }
      }
      uVar22 = 6;
      if ((char)uVar21 != '\a') {
        uVar22 = uVar21;
      }
      if ((*(byte *)(lVar8 + 2) & 1) == 0) {
        uVar16 = (ulong)(uVar22 & 0xff);
      }
      else {
        uVar16 = (ulong)(byte)((byte)uVar22 ^ 7) * (ulong)*(uint *)(lVar8 + 8) + 0x10;
      }
      if (0xfffffffe < uVar16) {
        uVar16 = 0xffffffff;
      }
      *(int *)(lVar8 + 0xc) = (int)uVar16;
      plVar12 = plVar12 + 1;
    } while (uVar4 * 8 - (long)plVar12 != 0);
  }
  lVar8 = 0;
  plVar12 = plVar6 + uVar4;
LAB_00129130:
  do {
    uVar16 = (long)plVar12 - (long)plVar6 >> 3;
    if (7 < uVar16) {
      plVar13 = plVar12 + -1;
      lVar19 = *(long *)((long)plVar6 + (uVar16 & 0xfffffffffffffffe) * 4);
      *(long *)((long)plVar6 + (uVar16 & 0xfffffffffffffffe) * 4) = *plVar6;
      *plVar6 = lVar19;
      lVar9 = plVar6[1];
      lVar17 = plVar12[-1];
      uVar21 = *(uint *)(lVar9 + 0xc);
      uVar22 = *(uint *)(lVar17 + 0xc);
      if (uVar22 < uVar21) {
        plVar6[1] = lVar17;
        *plVar13 = lVar9;
        lVar19 = *plVar6;
        lVar17 = lVar9;
        uVar22 = uVar21;
      }
      uVar21 = *(uint *)(lVar19 + 0xc);
      if (uVar22 < uVar21) {
        *plVar6 = lVar17;
        *plVar13 = lVar19;
        lVar19 = *plVar6;
        uVar21 = *(uint *)(lVar19 + 0xc);
      }
      plVar18 = plVar6 + 1;
      lVar9 = *plVar18;
      if (uVar21 < *(uint *)(lVar9 + 0xc)) {
        plVar6[1] = lVar19;
        *plVar6 = lVar9;
      }
LAB_00129218:
      if (plVar18 < plVar13) break;
      goto LAB_00129232;
    }
    if ((plVar6 != plVar12) && (1 < uVar16)) {
      plVar13 = plVar6 + 1;
      do {
        if (plVar6 < plVar13) {
          lVar9 = *plVar13;
          uVar21 = *(uint *)(lVar9 + 0xc);
          plVar18 = plVar13;
          do {
            lVar17 = plVar18[-1];
            if (*(uint *)(lVar17 + 0xc) <= uVar21) break;
            plVar18[-1] = lVar9;
            *plVar18 = lVar17;
            plVar18 = plVar18 + -1;
          } while (plVar6 < plVar18);
        }
        plVar13 = plVar13 + 1;
      } while (plVar13 < (long *)(((long)plVar12 - (long)plVar6) + (long)plVar6));
    }
    if (lVar8 == 0) {
      local_3e8 = 0;
      uStack_3e0 = 0;
      local_3f8 = 0;
      uStack_3f0 = 0;
      local_408 = 0;
      uStack_400 = 0;
      local_418 = 0;
      uStack_410 = 0;
      local_428 = 0;
      uStack_420 = 0;
      local_438._data = (void *)0x0;
      local_438._size = 0;
      local_438._capacity = 0;
      if (uVar4 != 0) {
        plVar12 = *(long **)(this + 0x18);
        plVar6 = plVar12 + uVar4;
        uVar4 = 0;
        goto LAB_001292e2;
      }
      iVar10 = -1;
      goto LAB_0012945a;
    }
    plVar6 = *(long **)((long)&local_448 + lVar8);
    plVar12 = *(long **)((long)&local_440 + lVar8);
    lVar8 = lVar8 + -0x10;
  } while( true );
  plVar7 = plVar18 + 1;
  plVar18 = plVar18 + 1;
  if (*(uint *)(*plVar7 + 0xc) < *(uint *)(*plVar6 + 0xc)) goto LAB_00129218;
LAB_00129232:
  do {
    if (plVar13 <= plVar6) break;
    plVar7 = plVar13 + -1;
    plVar13 = plVar13 + -1;
  } while (*(uint *)(*plVar6 + 0xc) < *(uint *)(*plVar7 + 0xc));
  if (plVar18 <= plVar13) {
    lVar9 = *plVar18;
    *plVar18 = *plVar13;
    *plVar13 = lVar9;
    goto LAB_00129218;
  }
  lVar9 = *plVar6;
  *plVar6 = *plVar13;
  *plVar13 = lVar9;
  plVar7 = plVar6;
  plVar20 = plVar12;
  if ((long)plVar12 - (long)plVar18 < (long)plVar13 - (long)plVar6) {
    plVar7 = plVar18;
    plVar18 = plVar6;
    plVar20 = plVar13;
    plVar13 = plVar12;
  }
  *(long **)((long)&local_438._data + lVar8) = plVar18;
  *(long **)((long)&local_438._size + lVar8) = plVar20;
  if (0x3f0 < lVar8) goto LAB_0012947c;
  lVar8 = lVar8 + 0x10;
  plVar6 = plVar7;
  plVar12 = plVar13;
  goto LAB_00129130;
LAB_001292e2:
  lVar8 = *plVar12;
  if ((*(byte *)(lVar8 + 2) & 2) == 0) {
    bVar2 = *(byte *)(lVar8 + 1);
    uVar22 = -(uint)bVar2 & ((int)uVar4 + (uint)bVar2) - 1;
    uVar21 = *(uint *)(lVar8 + 4);
    uVar16 = (ulong)uVar21;
    if (uVar21 < 0x40) {
      iVar10 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
        }
      }
      uVar5 = (ulong)(uint)(iVar10 << 4) | 8;
      do {
        iVar10 = *(int *)((long)&local_438._data + uVar5);
        if (iVar10 != 0) {
          uVar14 = iVar10 - 1;
          pRVar15 = (RAStackAllocator *)(ulong)uVar14;
          *(uint *)((long)&local_438._data + uVar5) = uVar14;
          uVar11 = *(uint *)(*(long *)((long)&local_440 + uVar5) + (long)pRVar15 * 8);
          if (uVar11 % (uint)bVar2 != 0) goto LAB_0012948b;
          iVar10 = *(int *)(*(long *)((long)&local_440 + uVar5) + 4 + (long)pRVar15 * 8);
          *(uint *)(lVar8 + 0x10) = uVar11;
          iVar10 = iVar10 - uVar21;
          uVar5 = (ulong)(uVar11 - uVar21);
          bVar24 = true;
          pRVar15 = (RAStackAllocator *)CONCAT71((uint7)(uint3)(uVar14 >> 8),1);
          goto LAB_00129369;
        }
        uVar5 = uVar5 + 0x10;
      } while (uVar5 != 0x68);
    }
    iVar10 = uVar22 - (int)uVar4;
    bVar24 = iVar10 == 0;
    uVar5 = 0;
    pRVar15 = (RAStackAllocator *)0x0;
    uVar4 = (ulong)uVar22;
LAB_00129369:
    if (iVar10 != 0) {
      uVar23 = (ulong)uVar22;
      if (bVar24) {
        uVar23 = uVar5;
      }
      uVar22 = (uint)uVar23;
      uVar11 = iVar10 + uVar22;
      while (uVar21 = (uint)uVar16, uVar22 < uVar11) {
        iVar10 = 0;
        uVar14 = (uint)uVar23;
        if (uVar14 != 0) {
          for (; (uVar14 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
          }
        }
        uVar22 = 1 << ((byte)iVar10 & 0x1f);
        if (uVar11 - uVar14 < uVar22) break;
        uVar5 = (ulong)(uint)(iVar10 << 4);
        this_00 = (ZoneVectorBase *)((long)&local_438._data + uVar5);
        uVar21 = *(uint *)((long)&local_438._size + uVar5);
        if (uVar21 == *(uint *)((long)&local_438._capacity + uVar5)) {
          local_448 = plVar6;
          local_440 = uVar4;
          EVar3 = ZoneVectorBase::_grow(this_00,*(ZoneAllocator **)this,8,1);
          if (EVar3 != 0) {
            return EVar3;
          }
          uVar21 = *(uint *)((long)&local_438._size + uVar5);
          uVar4 = local_440;
          plVar6 = local_448;
        }
        uVar16 = uVar23 | (ulong)uVar22 << 0x20;
        *(ulong *)((long)this_00->_data + (ulong)uVar21 * 8) = uVar16;
        piVar1 = (int *)((long)&local_438._size + uVar5);
        *piVar1 = *piVar1 + 1;
        uVar22 = uVar22 + uVar14;
        uVar23 = (ulong)uVar22;
      }
    }
    if ((char)pRVar15 == '\0') {
      if ((int)((uVar4 & 0xffffffff) % (ulong)bVar2) != 0) goto LAB_00129486;
      *(int *)(lVar8 + 0x10) = (int)uVar4;
      uVar4 = (ulong)(uint)((int)uVar4 + *(int *)(lVar8 + 4));
    }
  }
  plVar12 = plVar12 + 1;
  if (plVar12 == plVar6) {
    iVar10 = (int)uVar4 + -1;
LAB_0012945a:
    *(int *)(this + 0xc) = -*(int *)(this + 0x10) & iVar10 + *(int *)(this + 0x10);
    return 0;
  }
  goto LAB_001292e2;
LAB_0012947c:
  calculateStackFrame();
LAB_00129481:
  uVar21 = (uint)plVar12;
  calculateStackFrame();
  pRVar15 = this;
LAB_00129486:
  calculateStackFrame();
LAB_0012948b:
  calculateStackFrame();
  uVar22 = *(uint *)(pRVar15 + 0x20);
  if ((ulong)uVar22 != 0) {
    lVar8 = *(long *)(pRVar15 + 0x18);
    lVar9 = 0;
    do {
      if ((*(byte *)(*(long *)(lVar8 + lVar9) + 2) & 2) == 0) {
        piVar1 = (int *)(*(long *)(lVar8 + lVar9) + 0x10);
        *piVar1 = *piVar1 + uVar21;
      }
      lVar9 = lVar9 + 8;
    } while ((ulong)uVar22 << 3 != lVar9);
  }
  return 0;
}

Assistant:

Error RAStackAllocator::calculateStackFrame() noexcept {
  // Base weight added to all registers regardless of their size and alignment.
  uint32_t kBaseRegWeight = 16;

  // STEP 1:
  //
  // Update usage based on the size of the slot. We boost smaller slots in a way that 32-bit register has a higher
  // priority than a 128-bit register, however, if one 128-bit register is used 4 times more than some other 32-bit
  // register it will overweight it.
  for (RAStackSlot* slot : _slots) {
    uint32_t alignment = slot->alignment();
    ASMJIT_ASSERT(alignment > 0);

    uint32_t power = Support::min<uint32_t>(Support::ctz(alignment), 6);
    uint64_t weight;

    if (slot->isRegHome())
      weight = kBaseRegWeight + (uint64_t(slot->useCount()) * (7 - power));
    else
      weight = power;

    // If overflown, which has less chance of winning a lottery, just use max possible weight. In such case it
    // probably doesn't matter at all.
    if (weight > 0xFFFFFFFFu)
      weight = 0xFFFFFFFFu;

    slot->setWeight(uint32_t(weight));
  }

  // STEP 2:
  //
  // Sort stack slots based on their newly calculated weight (in descending order).
  _slots.sort([](const RAStackSlot* a, const RAStackSlot* b) noexcept {
    return a->weight() >  b->weight() ? 1 :
           a->weight() == b->weight() ? 0 : -1;
  });

  // STEP 3:
  //
  // Calculate offset of each slot. We start from the slot that has the highest weight and advance to slots with
  // lower weight. It could look that offsets start from the first slot in our list and then simply increase, but
  // it's not always the case as we also try to fill all gaps introduced by the fact that slots are sorted by
  // weight and not by size & alignment, so when we need to align some slot we distribute the gap caused by the
  // alignment to `gaps`.
  uint32_t offset = 0;
  ZoneVector<RAStackGap> gaps[kSizeCount - 1];

  for (RAStackSlot* slot : _slots) {
    if (slot->isStackArg())
      continue;

    uint32_t slotAlignment = slot->alignment();
    uint32_t alignedOffset = Support::alignUp(offset, slotAlignment);

    // Try to find a slot within gaps first, before advancing the `offset`.
    bool foundGap = false;
    uint32_t gapSize = 0;
    uint32_t gapOffset = 0;

    {
      uint32_t slotSize = slot->size();
      if (slotSize < (1u << uint32_t(ASMJIT_ARRAY_SIZE(gaps)))) {
        // Iterate from the lowest to the highest possible.
        uint32_t index = Support::ctz(slotSize);
        do {
          if (!gaps[index].empty()) {
            RAStackGap gap = gaps[index].pop();

            ASMJIT_ASSERT(Support::isAligned(gap.offset, slotAlignment));
            slot->setOffset(int32_t(gap.offset));

            gapSize = gap.size - slotSize;
            gapOffset = gap.offset - slotSize;

            foundGap = true;
            break;
          }
        } while (++index < uint32_t(ASMJIT_ARRAY_SIZE(gaps)));
      }
    }

    // No gap found, we may create a new one(s) if the current offset is not aligned.
    if (!foundGap && offset != alignedOffset) {
      gapSize = alignedOffset - offset;
      gapOffset = alignedOffset;

      offset = alignedOffset;
    }

    // True if we have found a gap and not filled all of it or we aligned the current offset.
    if (gapSize) {
      uint32_t gapEnd = gapSize + gapOffset;
      while (gapOffset < gapEnd) {
        uint32_t index = Support::ctz(gapOffset);
        uint32_t slotSize = 1u << index;

        // Weird case, better to bail...
        if (gapEnd - gapOffset < slotSize)
          break;

        ASMJIT_PROPAGATE(gaps[index].append(allocator(), RAStackGap(gapOffset, slotSize)));
        gapOffset += slotSize;
      }
    }

    if (!foundGap) {
      ASMJIT_ASSERT(Support::isAligned(offset, slotAlignment));
      slot->setOffset(int32_t(offset));
      offset += slot->size();
    }
  }

  _stackSize = Support::alignUp(offset, _alignment);
  return kErrorOk;
}